

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

void __thiscall cursespp::ShortcutsWindow::~ShortcutsWindow(ShortcutsWindow *this)

{
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ShortcutsWindow_001c12e8;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ShortcutsWindow_001c14c0;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ShortcutsWindow_001c14f0;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__ShortcutsWindow_001c1518;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__ShortcutsWindow_001c1540;
  std::__cxx11::string::~string((string *)&this->originalKey);
  std::__cxx11::string::~string((string *)&this->activeKey);
  std::
  vector<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ::~vector(&this->entries);
  std::_Function_base::~_Function_base(&(this->changedCallback).super__Function_base);
  Window::~Window(&this->super_Window);
  return;
}

Assistant:

ShortcutsWindow::~ShortcutsWindow() {
}